

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFailure_CheckEqualFailureWithText_TestShell::createTest
          (TEST_TestFailure_CheckEqualFailureWithText_TestShell *this)

{
  TEST_TestFailure_CheckEqualFailureWithText_Test *this_00;
  TEST_TestFailure_CheckEqualFailureWithText_TestShell *this_local;
  
  this_00 = (TEST_TestFailure_CheckEqualFailureWithText_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0x5b);
  TEST_TestFailure_CheckEqualFailureWithText_Test::TEST_TestFailure_CheckEqualFailureWithText_Test
            (this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, CheckEqualFailureWithText)
{
    CheckEqualFailure f(test, failFileName, failLineNumber, "expected", "actual", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <expected>\n"
                  "\tbut was  <actual>\n"
                  "\tdifference starts at position 0 at: <          actual    >\n"
                  "\t                                               ^", f);
}